

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TIntermediate::addUniShapeConversion
          (TIntermediate *this,TOperator op,TType *type,TIntermTyped *node)

{
  int iVar1;
  TIntermTyped *pTVar2;
  uint uVar3;
  
  if (this->source == EShSourceHlsl) {
    if ((int)op < 0x1df) {
      if (((op == EOpFunctionCall) || (op == EOpMix)) || (op == EOpReturn)) goto LAB_00495a54;
    }
    else {
      uVar3 = op - EOpAssign;
      if (uVar3 < 0xf) {
        if ((0x7d0eU >> (uVar3 & 0x1f) & 1) == 0) {
          if (uVar3 == 0) goto LAB_00495a54;
        }
        else {
          iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
          if (iVar1 != 1) {
LAB_00495a54:
            pTVar2 = addShapeConversion(this,type,node);
            return pTVar2;
          }
        }
      }
    }
  }
  return node;
}

Assistant:

TIntermTyped* TIntermediate::addUniShapeConversion(TOperator op, const TType& type, TIntermTyped* node)
{
    // some source languages don't do this
    switch (getSource()) {
    case EShSourceHlsl:
        break;
    case EShSourceGlsl:
    default:
        return node;
    }

    // some operations don't do this
    switch (op) {
    case EOpFunctionCall:
    case EOpReturn:
        break;

    case EOpMulAssign:
        // want to support vector *= scalar native ops in AST and lower, not smear, similarly for
        // matrix *= scalar, etc.

    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:
        if (node->getVectorSize() == 1)
            return node;
        break;

    case EOpAssign:
        break;

    case EOpMix:
        break;

    default:
        return node;
    }

    return addShapeConversion(type, node);
}